

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

Real Diffusion::get_scaled_abs_tol(MultiFab *rhs,Real reduction)

{
  int iVar1;
  int comp;
  double dVar2;
  Real RVar3;
  
  iVar1 = (rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  if (iVar1 < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    comp = 0;
    do {
      RVar3 = amrex::MultiFab::norm0(rhs,comp,0,false,true);
      dVar2 = dVar2 + RVar3 * (1.0 / (double)iVar1);
      comp = comp + 1;
    } while (comp < (rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp);
  }
  return dVar2 * reduction;
}

Assistant:

Real
Diffusion::get_scaled_abs_tol (const MultiFab& rhs,
                               Real            reduction) //const
{
    Real oncomp(1.0/rhs.nComp());
    Real rhs_avg_norm(0.0);
    // Let's take an average on all the components
    // This is the only way I can think of to prevent absolute tolerance to be
    // execessively small
    for (int comp(0); comp < rhs.nComp(); ++comp)
        rhs_avg_norm += oncomp * rhs.norm0(comp,0,false,true);
    return reduction * rhs_avg_norm;
}